

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineCache.cpp
# Opt level: O0

void __thiscall
Js::PolymorphicInlineCache::CacheAccessor
          (PolymorphicInlineCache *this,bool isGetter,PropertyId propertyId,
          PropertyIndex propertyIndex,bool isInlineSlot,Type *type,DynamicObject *object,
          bool isOnProto,ScriptContext *requestContext)

{
  bool bVar1;
  uint16 uVar2;
  uint inlineCacheIndex_00;
  PropertyRecord *this_00;
  char16 *pcVar3;
  uint inlineCacheIndex;
  bool isOnProto_local;
  Type *type_local;
  bool isInlineSlot_local;
  PropertyIndex propertyIndex_local;
  PropertyId propertyId_local;
  bool isGetter_local;
  PolymorphicInlineCache *this_local;
  
  inlineCacheIndex_00 = GetInlineCacheIndexForType(this,type);
  bVar1 = Phases::IsEnabled((Phases *)&DAT_01eafdf0,CloneCacheInCollisionPhase);
  if ((((!bVar1) && (bVar1 = InlineCache::IsEmpty(this->inlineCaches + inlineCacheIndex_00), !bVar1)
       ) && (bVar1 = InlineCache::NeedsToBeRegisteredForStoreFieldInvalidation
                               (this->inlineCaches + inlineCacheIndex_00), !bVar1)) &&
     (uVar2 = GetSize(this), uVar2 != 1)) {
    bVar1 = InlineCache::IsLocal(this->inlineCaches + inlineCacheIndex_00);
    if (bVar1) {
      CloneInlineCacheToEmptySlotInCollision<true,false,false>(this,type,inlineCacheIndex_00);
    }
    else {
      bVar1 = InlineCache::IsProto(this->inlineCaches + inlineCacheIndex_00);
      if (bVar1) {
        CloneInlineCacheToEmptySlotInCollision<false,true,false>(this,type,inlineCacheIndex_00);
      }
      else {
        CloneInlineCacheToEmptySlotInCollision<false,false,true>(this,type,inlineCacheIndex_00);
      }
    }
  }
  InlineCache::CacheAccessor
            (this->inlineCaches + inlineCacheIndex_00,isGetter,propertyId,propertyIndex,isInlineSlot
             ,type,object,isOnProto,requestContext);
  UpdateInlineCachesFillInfo(this,inlineCacheIndex_00,true);
  bVar1 = Phases::IsEnabled((Phases *)&DAT_01ec1678,PolymorphicInlineCachePhase);
  if ((bVar1) && ((DAT_01ec73ca & 1) != 0)) {
    this_00 = ScriptContext::GetPropertyName(requestContext,propertyId);
    pcVar3 = PropertyRecord::GetBuffer(this_00);
    Output::Print(L"PIC::CacheAccessor, %s, %d: ",pcVar3,(ulong)inlineCacheIndex_00);
    InlineCache::Dump(this->inlineCaches + inlineCacheIndex_00);
    Output::Print(L"\n");
    Output::Flush();
  }
  return;
}

Assistant:

void PolymorphicInlineCache::CacheAccessor(
        const bool isGetter,
        const PropertyId propertyId,
        const PropertyIndex propertyIndex,
        const bool isInlineSlot,
        Type *const type,
        DynamicObject *const object,
        const bool isOnProto,
        ScriptContext *const requestContext)
    {
        uint inlineCacheIndex = GetInlineCacheIndexForType(type);
#if INTRUSIVE_TESTTRACE_PolymorphicInlineCache
        bool collision = !inlineCaches[inlineCacheIndex].IsEmpty();
#endif
        if (!PHASE_OFF1(Js::CloneCacheInCollisionPhase))
        {
            if (!inlineCaches[inlineCacheIndex].IsEmpty() && !inlineCaches[inlineCacheIndex].NeedsToBeRegisteredForStoreFieldInvalidation() && GetSize() != 1)
            {
                if (inlineCaches[inlineCacheIndex].IsLocal())
                {
                    CloneInlineCacheToEmptySlotInCollision<true, false, false>(type, inlineCacheIndex);
                }
                else if (inlineCaches[inlineCacheIndex].IsProto())
                {
                    CloneInlineCacheToEmptySlotInCollision<false, true, false>(type, inlineCacheIndex);
                }
                else
                {
                    CloneInlineCacheToEmptySlotInCollision<false, false, true>(type, inlineCacheIndex);
                }
            }
        }

        inlineCaches[inlineCacheIndex].CacheAccessor(isGetter, propertyId, propertyIndex, isInlineSlot, type, object, isOnProto, requestContext);
        UpdateInlineCachesFillInfo(inlineCacheIndex, true /*set*/);

#if DBG_DUMP
        if (PHASE_VERBOSE_TRACE1(Js::PolymorphicInlineCachePhase))
        {
            Output::Print(_u("PIC::CacheAccessor, %s, %d: "), requestContext->GetPropertyName(propertyId)->GetBuffer(), inlineCacheIndex);
            inlineCaches[inlineCacheIndex].Dump();
            Output::Print(_u("\n"));
            Output::Flush();
        }
#endif
        PHASE_PRINT_INTRUSIVE_TESTTRACE1(
            Js::PolymorphicInlineCachePhase,
            _u("TestTrace PIC: CacheAccessor, 0x%x, entryIndex = %d, collision = %s, entries = %d\n"), this, inlineCacheIndex, collision ? _u("true") : _u("false"), GetEntryCount());
    }